

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_constants_melee_critical(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  void *pvVar3;
  char *__s1;
  
  pvVar3 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  iVar2 = strcmp(__s1,"debuff-toh");
  if (iVar2 == 0) {
    *(wchar_t *)((long)pvVar3 + 0x98) = wVar1;
  }
  else {
    iVar2 = strcmp(__s1,"chance-weight-scale");
    if (iVar2 == 0) {
      *(wchar_t *)((long)pvVar3 + 0x9c) = wVar1;
    }
    else {
      iVar2 = strcmp(__s1,"chance-toh-scale");
      if (iVar2 == 0) {
        *(wchar_t *)((long)pvVar3 + 0xa0) = wVar1;
      }
      else {
        iVar2 = strcmp(__s1,"chance-level-scale");
        if (iVar2 == 0) {
          *(wchar_t *)((long)pvVar3 + 0xa4) = wVar1;
        }
        else {
          iVar2 = strcmp(__s1,"chance-toh-skill-scale");
          if (iVar2 == 0) {
            *(wchar_t *)((long)pvVar3 + 0xa8) = wVar1;
          }
          else {
            iVar2 = strcmp(__s1,"chance-offset");
            if (iVar2 == 0) {
              *(wchar_t *)((long)pvVar3 + 0xac) = wVar1;
            }
            else {
              iVar2 = strcmp(__s1,"chance-range");
              if (iVar2 == 0) {
                *(wchar_t *)((long)pvVar3 + 0xb0) = wVar1;
              }
              else {
                iVar2 = strcmp(__s1,"power-weight-scale");
                if (iVar2 == 0) {
                  *(wchar_t *)((long)pvVar3 + 0xb4) = wVar1;
                }
                else {
                  iVar2 = strcmp(__s1,"power-random");
                  if (iVar2 != 0) {
                    return PARSE_ERROR_UNDEFINED_DIRECTIVE;
                  }
                  *(wchar_t *)((long)pvVar3 + 0xb8) = wVar1;
                }
              }
            }
          }
        }
      }
    }
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_constants_melee_critical(struct parser *p)
{
	struct angband_constants *z = parser_priv(p);
	const char *label = parser_getsym(p, "label");
	int value = parser_getint(p, "value");

	if (streq(label, "debuff-toh")) {
		z->m_crit_debuff_toh = value;
	} else if (streq(label, "chance-weight-scale")) {
		z->m_crit_chance_weight_scl = value;
	} else if (streq(label, "chance-toh-scale")) {
		z->m_crit_chance_toh_scl = value;
	} else if (streq(label, "chance-level-scale")) {
		z->m_crit_chance_level_scl = value;
	} else if (streq(label, "chance-toh-skill-scale")) {
		z->m_crit_chance_toh_skill_scl = value;
	} else if (streq(label, "chance-offset")) {
		z->m_crit_chance_offset = value;
	} else if (streq(label, "chance-range")) {
		z->m_crit_chance_range = value;
	} else if (streq(label, "power-weight-scale")) {
		z->m_crit_power_weight_scl = value;
	} else if (streq(label, "power-random")) {
		z->m_crit_power_random = value;
	} else {
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;
	}

	return PARSE_ERROR_NONE;
}